

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O3

void test_fuzz(files *filesets)

{
  char *pcVar1;
  int iVar2;
  wchar_t wVar3;
  int iVar4;
  char *pcVar5;
  archive_conflict *a;
  ulong uVar6;
  char *__ptr;
  void *pvVar7;
  time_t tVar8;
  FILE *__s;
  size_t v2;
  archive *paVar9;
  void *pvVar10;
  char **names;
  uint uVar11;
  char ***pppcVar12;
  long lVar13;
  bool bVar14;
  size_t size;
  archive_entry *ae;
  int64_t blk_offset;
  size_t blk_size;
  void *blk;
  char *local_80;
  files *local_78;
  void *local_70;
  char ***local_68;
  long local_60;
  ulong local_58;
  archive_entry *local_50;
  la_int64_t local_48;
  size_t local_40;
  void *local_38;
  
  pcVar5 = getenv("SKIP_TEST_FUZZ");
  if (pcVar5 != (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                   ,L'@');
    test_skipping("Skipping fuzz tests due to SKIP_TEST_FUZZ environment variable");
    return;
  }
  names = filesets->names;
  if (names != (char **)0x0) {
    pppcVar12 = &filesets->names;
    lVar13 = 0;
    local_78 = filesets;
    do {
      local_80 = (char *)0x0;
      extract_reference_files(names);
      if (filesets[lVar13].uncompress == 0) {
        if (**pppcVar12 == (char *)0x0) {
          pvVar10 = (void *)0x0;
          local_60 = lVar13;
        }
        else {
          uVar6 = 8;
          pcVar5 = (char *)0x0;
          pvVar10 = (void *)0x0;
          local_68 = pppcVar12;
          local_60 = lVar13;
          do {
            local_58 = uVar6;
            __ptr = slurpfile((size_t *)&local_80,"%s");
            pvVar7 = realloc(pvVar10,(size_t)(local_80 + (long)pcVar5));
            wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                     ,L'|',(uint)(pvVar7 != (void *)0x0),"newraw != NULL",
                                     (void *)0x0);
            pcVar1 = local_80;
            if (wVar3 == L'\0') {
              free(__ptr);
              local_80 = (char *)0x0;
              goto LAB_00145159;
            }
            memcpy((char *)((long)pvVar7 + (long)pcVar5),__ptr,(size_t)local_80);
            pcVar5 = pcVar5 + (long)pcVar1;
            local_80 = pcVar5;
            free(__ptr);
            uVar6 = local_58 + 8;
            pvVar10 = pvVar7;
          } while (*(long *)((long)*local_68 + local_58) != 0);
        }
LAB_00144de3:
        local_70 = pvVar10;
        if (local_80 != (char *)0x0) {
          pvVar7 = malloc((size_t)local_80);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'\x8f',(uint)(pvVar7 != (void *)0x0),"image != NULL",(void *)0x0);
          pvVar10 = local_70;
          if (pvVar7 == (void *)0x0) {
            free(local_70);
            return;
          }
          uVar6 = 0;
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'\x96',(uint)(local_70 != (void *)0x0),"rawimage != NULL",(void *)0x0);
          tVar8 = time((time_t *)0x0);
          srand((uint)tVar8);
          do {
            pcVar5 = local_80;
            local_58 = uVar6;
            memcpy(pvVar7,pvVar10,(size_t)local_80);
            iVar2 = (int)pcVar5 / 100;
            if (iVar2 < 5) {
              iVar2 = 4;
            }
            iVar4 = rand();
            if (0 < (int)((long)iVar4 % (long)iVar2)) {
              uVar6 = (long)iVar4 % (long)iVar2 & 0xffffffff;
              do {
                iVar2 = rand();
                iVar4 = rand();
                *(char *)((long)pvVar7 + (ulong)(long)iVar4 % (ulong)local_80) = (char)iVar2;
                uVar11 = (int)uVar6 - 1;
                uVar6 = (ulong)uVar11;
              } while (uVar11 != 0);
            }
            iVar2 = 2;
            do {
              __s = fopen("after.test.failure.send.this.file.to.libarchive.maintainers.with.system.details"
                          ,"wb");
              bVar14 = iVar2 != 0;
              iVar2 = iVar2 + -1;
              if (__s != (FILE *)0x0) break;
            } while (bVar14);
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'·',(uint)(__s != (FILE *)0x0),"f != NULL",(void *)0x0);
            pcVar5 = local_80;
            v2 = fwrite(pvVar7,1,(size_t)local_80,__s);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'¸',(longlong)pcVar5,"(size_t)size",v2,
                                "fwrite(image, 1, (size_t)size, f)",(void *)0x0);
            fclose(__s);
            paVar9 = archive_read_new();
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'¼',(uint)(paVar9 != (archive *)0x0),
                             "(a = archive_read_new()) != NULL",(void *)0x0);
            iVar2 = archive_read_support_filter_all(paVar9);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'¾',0,"ARCHIVE_OK",(long)iVar2,
                                "archive_read_support_filter_all(a)",paVar9);
            iVar2 = archive_read_support_format_all(paVar9);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'À',0,"ARCHIVE_OK",(long)iVar2,
                                "archive_read_support_format_all(a)",paVar9);
            iVar2 = archive_read_open_memory(paVar9,pvVar7,(size_t)local_80);
            if (iVar2 == 0) {
              iVar2 = archive_read_next_header(paVar9,&local_50);
              while (iVar2 == 0) {
                do {
                  iVar2 = archive_read_data_block(paVar9,&local_38,&local_40,&local_48);
                } while (iVar2 == 0);
                iVar2 = archive_read_next_header(paVar9,&local_50);
              }
              archive_read_close(paVar9);
            }
            archive_read_free(paVar9);
            paVar9 = archive_read_new();
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'Í',(uint)(paVar9 != (archive *)0x0),
                             "(a = archive_read_new()) != NULL",(void *)0x0);
            iVar2 = archive_read_support_filter_all(paVar9);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'Ï',0,"ARCHIVE_OK",(long)iVar2,
                                "archive_read_support_filter_all(a)",paVar9);
            iVar2 = archive_read_support_format_all(paVar9);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'Ñ',0,"ARCHIVE_OK",(long)iVar2,
                                "archive_read_support_format_all(a)",paVar9);
            iVar2 = archive_read_open_memory(paVar9,pvVar7,(size_t)local_80);
            uVar6 = local_58;
            if (iVar2 == 0) {
              do {
                iVar2 = archive_read_next_header(paVar9,&local_50);
              } while (iVar2 == 0);
              archive_read_close(paVar9);
            }
            archive_read_free(paVar9);
            pvVar10 = local_70;
            uVar11 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar11;
          } while (uVar11 != 1000);
          free(pvVar7);
        }
LAB_00145159:
        free(pvVar10);
        lVar13 = local_60;
        filesets = local_78;
      }
      else {
        a = (archive_conflict *)archive_read_new();
        local_68 = pppcVar12;
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'Q',(uint)(a != (archive_conflict *)0x0),
                         "(a = archive_read_new()) != NULL",(void *)0x0);
        iVar2 = archive_read_support_filter_all((archive *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'S',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",a)
        ;
        iVar2 = archive_read_support_format_raw((archive *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'U',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_raw(a)",a)
        ;
        wVar3 = archive_read_open_filenames(a,*local_68,0x4000);
        if (wVar3 == L'\0') {
          local_60 = lVar13;
          iVar2 = archive_read_next_header((archive *)a,&local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'a',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a)
          ;
          local_70 = malloc(30000000);
          local_80 = (char *)archive_read_data((archive *)a,local_70,30000000);
          iVar2 = archive_read_next_header((archive *)a,&local_50);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'e',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",a
                             );
          iVar2 = archive_read_free((archive *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'g',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'h',(uint)(local_80 != (char *)0x0),"size > 0",(void *)0x0);
          if ((**local_68 == (char *)0x0) || ((*local_68)[1] == (char *)0x0)) {
            failure("Internal buffer is not big enough for uncompressed test files");
          }
          else {
            failure("Internal buffer is not big enough for uncompressed test file: %s");
          }
          filesets = local_78;
          wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                                   ,L'p',(uint)(local_80 < buff3 + 0x55b690),"size < buffsize",
                                   (void *)0x0);
          pvVar10 = local_70;
          if (wVar3 != L'\0') goto LAB_00144de3;
          free(local_70);
          lVar13 = local_60;
        }
        else {
          archive_read_free((archive *)a);
          pppcVar12 = local_68;
          if ((**local_68 == (char *)0x0) || ((*local_68)[1] == (char *)0x0)) {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'Z');
            test_skipping("Cannot uncompress fileset");
            filesets = local_78;
          }
          else {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'\\');
            test_skipping("Cannot uncompress %s",**pppcVar12);
            filesets = local_78;
          }
        }
      }
      lVar13 = lVar13 + 1;
      pppcVar12 = &filesets[lVar13].names;
      names = *pppcVar12;
    } while (names != (char **)0x0);
  }
  return;
}

Assistant:

static void
test_fuzz(const struct files *filesets)
{
	const void *blk;
	size_t blk_size;
	int64_t blk_offset;
	int n;
	const char *skip_fuzz_tests;

	skip_fuzz_tests = getenv("SKIP_TEST_FUZZ");
	if (skip_fuzz_tests != NULL) {
		skipping("Skipping fuzz tests due to SKIP_TEST_FUZZ "
		    "environment variable");
		return;
	}

	for (n = 0; filesets[n].names != NULL; ++n) {
		const size_t buffsize = 30000000;
		struct archive_entry *ae;
		struct archive *a;
		char *rawimage = NULL, *image = NULL, *tmp = NULL;
		size_t size = 0, oldsize = 0;
		int i, q;

		extract_reference_files(filesets[n].names);
		if (filesets[n].uncompress) {
			int r;
			/* Use format_raw to decompress the data. */
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_raw(a));
			r = archive_read_open_filenames(a, filesets[n].names, 16384);
			if (r != ARCHIVE_OK) {
				archive_read_free(a);
				if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
					skipping("Cannot uncompress fileset");
				} else {
					skipping("Cannot uncompress %s", filesets[n].names[0]);
				}
				continue;
			}
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			rawimage = malloc(buffsize);
			size = archive_read_data(a, rawimage, buffsize);
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
			assertEqualInt(ARCHIVE_OK,
			    archive_read_free(a));
			assert(size > 0);
			if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
				failure("Internal buffer is not big enough for "
					"uncompressed test files");
			} else {
				failure("Internal buffer is not big enough for "
					"uncompressed test file: %s", filesets[n].names[0]);
			}
			if (!assert(size < buffsize)) {
				free(rawimage);
				rawimage = NULL;
				continue;
			}
		} else {
			for (i = 0; filesets[n].names[i] != NULL; ++i)
			{
				char *newraw;
				tmp = slurpfile(&size, "%s",
						filesets[n].names[i]);
				newraw = realloc(rawimage, oldsize + size);
				if (!assert(newraw != NULL))
				{
					free(tmp);
					size = 0;
					break;
				}
				rawimage = newraw;
				memcpy(rawimage + oldsize, tmp, size);
				oldsize += size;
				size = oldsize;
				free(tmp);
			}
		}
		if (size == 0) {
			free(rawimage);
			rawimage = NULL;
			continue;
		}
		image = malloc(size);
		assert(image != NULL);
		if (image == NULL) {
			free(rawimage);
			rawimage = NULL;
			return;
		}

		assert(rawimage != NULL);

		srand((unsigned)time(NULL));

		for (i = 0; i < 1000; ++i) {
			FILE *f;
			int j, numbytes, trycnt;

			/* Fuzz < 1% of the bytes in the archive. */
			memcpy(image, rawimage, size);
			q = (int)size / 100;
			if (q < 4)
				q = 4;
			numbytes = (int)(rand() % q);
			for (j = 0; j < numbytes; ++j)
				image[rand() % size] = (char)rand();

			/* Save the messed-up image to a file.
			 * If we crash, that file will be useful. */
			for (trycnt = 0; trycnt < 3; trycnt++) {
				f = fopen("after.test.failure.send.this.file."
				    "to.libarchive.maintainers.with.system.details", "wb");
				if (f != NULL)
					break;
#if defined(_WIN32) && !defined(__CYGWIN__)
				/*
				 * Sometimes previous close operation does not completely
				 * end at this time. So we should take a wait while
				 * the operation running.
				 */
				Sleep(100);
#endif
			}
			assert(f != NULL);
			assertEqualInt((size_t)size, fwrite(image, 1, (size_t)size, f));
			fclose(f);

			// Try to read all headers and bodies.
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
					while (0 == archive_read_data_block(a,
						&blk, &blk_size, &blk_offset))
						continue;
				}
				archive_read_close(a);
			}
			archive_read_free(a);

			// Just list headers, skip bodies.
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
				}
				archive_read_close(a);
			}
			archive_read_free(a);
		}
		free(image);
		free(rawimage);
	}
}